

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

RationalNum operator/(RationalNum *left,RationalNum *right)

{
  int iVar1;
  int iVar2;
  RationalNum RVar3;
  undefined1 local_48 [8];
  RationalNum temp_2;
  RationalNum temp_1;
  RationalNum *right_local;
  RationalNum *left_local;
  
  iVar1 = RationalNum::getNumerator(left);
  iVar2 = RationalNum::getDenominator(left);
  RationalNum::RationalNum((RationalNum *)&temp_2.denominator,(long)iVar1,(long)iVar2);
  iVar1 = RationalNum::getDenominator(right);
  iVar2 = RationalNum::getNumerator(right);
  RationalNum::RationalNum((RationalNum *)local_48,(long)iVar1,(long)iVar2);
  RVar3 = operator*((RationalNum *)&temp_2.denominator,(RationalNum *)local_48);
  return RVar3;
}

Assistant:

RationalNum operator/(const RationalNum &left, const RationalNum &right) {
    RationalNum temp_1(left.getNumerator(), left.getDenominator());
    RationalNum temp_2(right.getDenominator(), right.getNumerator());
    return temp_1 * temp_2;
}